

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O1

void readvector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *c,string *filename)

{
  char cVar1;
  istream *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  string stra;
  string str;
  ifstream b;
  value_type local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2c0;
  undefined1 *local_2b8;
  ulong local_2b0;
  undefined1 local_2a8 [16];
  char *local_298;
  ulong local_290;
  char local_288 [16];
  char *local_278;
  ulong local_270;
  char local_268 [16];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  long local_238 [65];
  
  local_2b8 = local_2a8;
  local_2b0 = 0;
  local_2a8[0] = 0;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  local_2c0 = c;
  std::ifstream::ifstream(local_238);
  std::ifstream::open((string *)local_238,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nfailure to read file",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2b8,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      std::ifstream::~ifstream(local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8);
      }
      return;
    }
    lVar3 = std::__cxx11::string::find((char *)&local_2b8,0x10d08c,0);
    if (lVar3 != -1) {
      std::__cxx11::string::find((char *)&local_2b8,0x10d08c,0);
      std::__cxx11::string::substr((ulong)local_258,(ulong)&local_2b8);
      std::__cxx11::string::operator=((string *)&local_2b8,(string *)local_258);
      if (local_258[0] != local_248) {
        operator_delete(local_258[0]);
      }
    }
    if (local_2b0 != 0) {
      uVar6 = 0;
      do {
        if (local_2b8[uVar6] == ' ') {
          std::__cxx11::string::substr((ulong)local_258,(ulong)&local_2b8);
          std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_258);
          if (local_258[0] != local_248) {
            operator_delete(local_258[0]);
          }
          local_278 = local_268;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          bVar7 = local_270 != 0;
          if ((bVar7) && (bVar7 = true, *local_278 == ' ')) {
            uVar5 = 1;
            do {
              uVar4 = uVar5;
              if (local_270 == uVar4) break;
              uVar5 = uVar4 + 1;
            } while (local_278[uVar4] == ' ');
            bVar7 = uVar4 < local_270;
          }
          if (local_278 != local_268) {
            operator_delete(local_278);
          }
          if (bVar7) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_2c0,&local_2e0);
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_2b0);
    }
    std::__cxx11::string::substr((ulong)local_258,(ulong)&local_2b8);
    std::__cxx11::string::operator=((string *)&local_2e0,(string *)local_258);
    if (local_258[0] != local_248) {
      operator_delete(local_258[0]);
    }
    local_298 = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    bVar7 = local_290 != 0;
    if ((bVar7) && (bVar7 = true, *local_298 == ' ')) {
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        if (local_290 == uVar5) break;
        uVar6 = uVar5 + 1;
      } while (local_298[uVar5] == ' ');
      bVar7 = uVar5 < local_290;
    }
    if (local_298 != local_288) {
      operator_delete(local_298);
    }
    if (bVar7) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_2c0,&local_2e0);
    }
  } while( true );
}

Assistant:

void readvector(vector<string>& c,string filename)
{
	string str,stra;
	int ignore=0;
	int begin = 0;
	int l=0;
	int i = 0;
	int j = 0;
	ifstream b;
	b.open(filename);
	if (!b.is_open()) { cout << "\nfailure to read file" << endl; }
	while (getline(b, str))
	{
			if (str.find("//") != string::npos)
			{
				str = str.substr(0, str.find("//"));
			}
			for (i = 0; i < str.length(); i++)
			{
				l++;
				if (str.at(i) == ' ')
				{
					stra = str.substr(begin, l - 1);
					if (check_string( stra)) {
						c.push_back(stra);
						begin = i + 1;
						l = 0;
					}
					
				}
			}
			stra = str.substr(begin);
			if (check_string(stra))
			{
				c.push_back(stra);
			}
			l = 0;
			begin = 0;


	}
	b.close();

	return;
}